

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_registers.h
# Opt level: O1

void __thiscall n_e_s::core::PpuVram::increase_y(PpuVram *this)

{
  ushort uVar1;
  ushort uVar2;
  
  uVar2 = (this->super_Register<unsigned_short>).value_;
  uVar1 = uVar2 & 0x8fff;
  if ((~uVar2 & 0x7000) == 0) {
    (this->super_Register<unsigned_short>).value_ = uVar1;
    uVar1 = uVar2 & 0x8c1f;
    if ((~(byte)(uVar2 >> 5) & 0x1f) == 0) goto LAB_00117fe3;
    if ((uVar2 >> 5 & 0x1f) == 0x1d) {
      uVar1 = uVar1 ^ 0x800;
      goto LAB_00117fe3;
    }
    uVar2 = uVar2 + 0x20 & 0x3e0;
  }
  else {
    uVar2 = uVar2 + 0x1000 & 0x7000;
  }
  uVar1 = uVar1 | uVar2;
LAB_00117fe3:
  (this->super_Register<unsigned_short>).value_ = uVar1;
  return;
}

Assistant:

[[nodiscard]] constexpr uint8_t fine_scroll_y() const {
        return static_cast<uint8_t>(value_ >> 12u) & 0b0000'0111u;
    }